

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O3

StringLiteral * __thiscall
StringLiteral::operator+
          (StringLiteral *__return_storage_ptr__,StringLiteral *this,StringLiteral *other)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,&this->_value,&other->_value);
  paVar1 = &(__return_storage_ptr__->_value).field_2;
  (__return_storage_ptr__->_value)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == &local_30.field_2) {
    paVar1->_M_allocated_capacity = local_30.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->_value).field_2 + 8) = local_30.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_value)._M_dataplus._M_p = local_30._M_dataplus._M_p;
    (__return_storage_ptr__->_value).field_2._M_allocated_capacity =
         local_30.field_2._M_allocated_capacity;
  }
  (__return_storage_ptr__->_value)._M_string_length = local_30._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

StringLiteral StringLiteral::operator+(const StringLiteral &other) const
{
	return StringLiteral(_value + other._value);
}